

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageDashedLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  int iVar1;
  double dVar2;
  double as_1;
  double as;
  int thick;
  int vert;
  int wid;
  int on;
  int dashStep;
  int ydirflag;
  int xdirflag;
  int yend;
  int xend;
  int y;
  int x;
  int d;
  int incr2;
  int incr1;
  int dy;
  int dx;
  int color_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  gdImagePtr im_local;
  
  wid = 0;
  vert = 1;
  iVar1 = im->thick;
  incr1 = x2 - x1;
  if (incr1 < 1) {
    incr1 = -incr1;
  }
  incr2 = y2 - y1;
  if (incr2 < 1) {
    incr2 = -incr2;
  }
  dy = color;
  dx = y2;
  color_local = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = im;
  if (incr1 < incr2) {
    dVar2 = atan2((double)incr2,(double)incr1);
    dVar2 = sin(dVar2);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      thick = (int)((double)iVar1 / dVar2);
    }
    else {
      thick = 1;
    }
    y = incr1 * 2 - incr2;
    d = incr1 << 1;
    x = (incr1 - incr2) * 2;
    if (dx < y2_local) {
      yend = dx;
      xend = color_local;
      ydirflag = y2_local;
      dashStep = -1;
    }
    else {
      yend = y2_local;
      xend = x2_local;
      ydirflag = dx;
      dashStep = 1;
    }
    dashedSet(_y1_local,xend,yend,dy,&vert,&wid,thick,0);
    if ((color_local - x2_local) * dashStep < 1) {
      while (yend < ydirflag) {
        yend = yend + 1;
        iVar1 = d;
        if (-1 < y) {
          xend = xend + -1;
          iVar1 = x;
        }
        y = iVar1 + y;
        dashedSet(_y1_local,xend,yend,dy,&vert,&wid,thick,0);
      }
    }
    else {
      while (yend < ydirflag) {
        yend = yend + 1;
        iVar1 = d;
        if (-1 < y) {
          xend = xend + 1;
          iVar1 = x;
        }
        y = iVar1 + y;
        dashedSet(_y1_local,xend,yend,dy,&vert,&wid,thick,0);
      }
    }
  }
  else {
    dVar2 = atan2((double)incr2,(double)incr1);
    dVar2 = sin(dVar2);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      thick = (int)((double)iVar1 / dVar2);
    }
    else {
      thick = 1;
    }
    y = incr2 * 2 - incr1;
    d = incr2 << 1;
    x = (incr2 - incr1) * 2;
    if (color_local < x2_local) {
      xend = color_local;
      yend = dx;
      on = -1;
      xdirflag = x2_local;
    }
    else {
      xend = x2_local;
      yend = y2_local;
      on = 1;
      xdirflag = color_local;
    }
    dashedSet(_y1_local,xend,yend,dy,&vert,&wid,thick,1);
    if ((dx - y2_local) * on < 1) {
      while (xend < xdirflag) {
        xend = xend + 1;
        iVar1 = d;
        if (-1 < y) {
          yend = yend + -1;
          iVar1 = x;
        }
        y = iVar1 + y;
        dashedSet(_y1_local,xend,yend,dy,&vert,&wid,thick,1);
      }
    }
    else {
      while (xend < xdirflag) {
        xend = xend + 1;
        iVar1 = d;
        if (-1 < y) {
          yend = yend + 1;
          iVar1 = x;
        }
        y = iVar1 + y;
        dashedSet(_y1_local,xend,yend,dy,&vert,&wid,thick,1);
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageDashedLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int dashStep = 0;
	int on = 1;
	int wid;
	int vert;
	int thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);
	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		vert = 1;

		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}
		dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		}
	} else {
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		vert = 0;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}
		dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		}
	}
}